

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::setInputNotificationCallback
          (ValueFederate *this,Input *inp,
          function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *callback)

{
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RDX;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffff98;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffb8;
  Input *in_stack_ffffffffffffffc0;
  
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x381066);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::function
            (in_RDX,in_stack_ffffffffffffff98);
  ValueFederateManager::setInputNotificationCallback
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
            ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)0x38109f)
  ;
  return;
}

Assistant:

void ValueFederate::setInputNotificationCallback(Input& inp,
                                                 std::function<void(Input&, Time)> callback)
{
    vfManager->setInputNotificationCallback(inp, std::move(callback));
}